

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifilt.cpp
# Opt level: O3

UMatchDegree __thiscall
icu_63::UnicodeFilter::matches
          (UnicodeFilter *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *offset;
  if (iVar3 < limit) {
    uVar1 = (*(text->super_UObject)._vptr_UObject[10])(text);
    iVar2 = (*(this->super_UnicodeFunctor).super_UObject._vptr_UObject[7])(this,(ulong)uVar1);
    iVar3 = *offset;
    if ((char)iVar2 != '\0') {
      *offset = (iVar3 - (uint)(uVar1 < 0x10000)) + 2;
      return U_MATCH;
    }
  }
  if (limit < iVar3) {
    uVar1 = (*(text->super_UObject)._vptr_UObject[10])(text);
    iVar2 = (*(this->super_UnicodeFunctor).super_UObject._vptr_UObject[7])(this,(ulong)uVar1);
    iVar3 = *offset;
    if ((char)iVar2 != '\0') {
      *offset = iVar3 - 1U;
      if (iVar3 < 1) {
        return U_MATCH;
      }
      uVar1 = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)(iVar3 - 1U));
      *offset = *offset + -1 + (uint)(uVar1 < 0x10000);
      return U_MATCH;
    }
  }
  return (uint)(iVar3 == limit && incremental != '\0');
}

Assistant:

UMatchDegree UnicodeFilter::matches(const Replaceable& text,
                                    int32_t& offset,
                                    int32_t limit,
                                    UBool incremental) {
    UChar32 c;
    if (offset < limit &&
        contains(c = text.char32At(offset))) {
        offset += U16_LENGTH(c);
        return U_MATCH;
    }
    if (offset > limit &&
        contains(c = text.char32At(offset))) {
        // Backup offset by 1, unless the preceding character is a
        // surrogate pair -- then backup by 2 (keep offset pointing at
        // the lead surrogate).
        --offset;
        if (offset >= 0) {
            offset -= U16_LENGTH(text.char32At(offset)) - 1;
        }
        return U_MATCH;
    }
    if (incremental && offset == limit) {
        return U_PARTIAL_MATCH;
    }
    return U_MISMATCH;
}